

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O1

void qpdf_replace_object(qpdf_data qpdf,int objid,int generation,qpdf_oh oh)

{
  _Any_data local_28;
  code *local_18;
  code *pcStack_10;
  
  local_28._12_4_ = generation;
  local_28._8_4_ = objid;
  pcStack_10 = std::
               _Function_handler<void_(QPDFObjectHandle_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:947:31)>
               ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(QPDFObjectHandle_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:947:31)>
             ::_M_manager;
  local_28._M_unused._M_object = qpdf;
  do_with_oh_void(qpdf,oh,(function<void_(QPDFObjectHandle_&)> *)&local_28);
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  return;
}

Assistant:

void
qpdf_replace_object(qpdf_data qpdf, int objid, int generation, qpdf_oh oh)
{
    do_with_oh_void(qpdf, oh, [qpdf, objid, generation](QPDFObjectHandle& o) {
        QTC::TC("qpdf", "qpdf-c called qpdf_replace_object");
        qpdf->qpdf->replaceObject(objid, generation, o);
    });
}